

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWOBSurface(LWOImporter *this,uint size)

{
  uint8_t **outFile;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  pointer pSVar1;
  ushort uVar2;
  SubChunkHeader SVar3;
  Logger *pLVar4;
  Texture *out;
  DeadlyImportError *pDVar5;
  Axes AVar6;
  uint uVar7;
  uint max;
  uint *puVar8;
  byte *pbVar9;
  uint32_t uVar10;
  TextureList *list;
  char *message;
  byte *pbVar11;
  ulong uVar12;
  allocator local_1b1;
  pointer local_1b0;
  LWOImporter *local_1a8;
  TextureList *local_1a0;
  TextureList *local_198;
  TextureList *local_190;
  TextureList *local_188;
  TextureList *local_180;
  Surface local_178;
  
  pbVar11 = this->mFileBuffer + size;
  this_00 = this->mSurfaces;
  LWO::Surface::Surface(&local_178);
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
  emplace_back<Assimp::LWO::Surface>(this_00,&local_178);
  outFile = &this->mFileBuffer;
  LWO::Surface::~Surface(&local_178);
  pSVar1 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  GetS0(this,&pSVar1[-1].mName,size);
  local_180 = &pSVar1[-1].mOpacityTextures;
  local_188 = &pSVar1[-1].mBumpTextures;
  local_190 = &pSVar1[-1].mSpecularTextures;
  local_198 = &pSVar1[-1].mDiffuseTextures;
  local_1a0 = &pSVar1[-1].mColorTextures;
  pbVar9 = this->mFileBuffer;
  out = (Texture *)0x0;
  local_1b0 = pSVar1;
  local_1a8 = this;
  do {
    if (pbVar11 <= pbVar9 + 6) {
      return;
    }
    SVar3 = IFF::LoadSubChunk(outFile);
    uVar2 = SVar3.length;
    puVar8 = (uint *)*outFile;
    uVar12 = (ulong)uVar2;
    if (pbVar11 < (byte *)((long)puVar8 + uVar12)) {
      pLVar4 = DefaultLogger::get();
      Logger::error(pLVar4,"LWOB: Invalid surface chunk length. Trying to continue.");
      puVar8 = (uint *)*outFile;
      uVar2 = (ushort)((long)pbVar11 - (long)puVar8);
      uVar12 = (long)pbVar11 - (long)puVar8 & 0xffff;
    }
    uVar10 = SVar3.type;
    uVar7 = (uint)uVar2;
    list = local_188;
    if (uVar10 == 0x42544558) {
LAB_005aee60:
      out = SetupNewTextureLWOB(local_1a8,list,uVar7);
    }
    else if (uVar10 == 0x5456414c) {
      if (uVar7 == 0) {
        pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_178,"LWO: TVAL chunk is too small",&local_1b1)
        ;
        DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
        __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (out == (Texture *)0x0) {
        pLVar4 = DefaultLogger::get();
        Logger::error(pLVar4,"LWOB: Unexpected TVAL chunk");
LAB_005aef10:
        out = (Texture *)0x0;
      }
      else {
        *outFile = (byte *)((long)puVar8 + 1);
        out->mStrength = (float)(byte)*puVar8 / 255.0;
      }
    }
    else {
      list = local_1a0;
      if (uVar10 == 0x43544558) goto LAB_005aee60;
      max = (uint)uVar2;
      if (uVar10 == 0x44494646) {
        if (max < 2) {
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_178,"LWO: DIFF chunk is too small",&local_1b1);
          DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar7 = *puVar8;
        *outFile = (uint8_t *)((long)puVar8 + 2);
        local_1b0[-1].mDiffuseValue =
             (float)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8) / 255.0;
      }
      else {
        list = local_198;
        if (uVar10 == 0x44544558) goto LAB_005aee60;
        if (uVar10 == 0x464c4147) {
          if (max < 2) {
            pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_178,"LWO: FLAG chunk is too small",&local_1b1);
            DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
            __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = *puVar8;
          *outFile = (uint8_t *)((long)puVar8 + 2);
          uVar2 = (ushort)uVar7 >> 8;
          if ((uVar2 & 4) != 0) {
            local_1b0[-1].mMaximumSmoothAngle = 1.56207;
          }
          if ((uVar2 & 8) != 0) {
            local_1b0[-1].mColorHighlights = 1.0;
          }
          if (((ushort)uVar7 & 1) != 0) {
            local_1b0[-1].bDoubleSided = true;
          }
        }
        else if (uVar10 == 0x474c4f53) {
          if (max < 2) {
            pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_178,"LWO: GLOS chunk is too small",&local_1b1);
            DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
            __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = *puVar8;
          *outFile = (uint8_t *)((long)puVar8 + 2);
          local_1b0[-1].mGlossiness = (float)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8);
        }
        else if (uVar10 == 0x4c554d49) {
          if (max < 2) {
            pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_178,"LWO: LUMI chunk is too small",&local_1b1);
            DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
            __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = *puVar8;
          *outFile = (uint8_t *)((long)puVar8 + 2);
          local_1b0[-1].mLuminosity =
               (float)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8) / 255.0;
        }
        else if (uVar10 == 0x534d414e) {
          if (max < 4) {
            pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_178,"LWO: SMAN chunk is too small",&local_1b1);
            DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
            __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = *puVar8;
          *outFile = (uint8_t *)(puVar8 + 1);
          local_1b0[-1].mMaximumSmoothAngle =
               (float)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      (uVar7 & 0x7f) << 0x18);
        }
        else if (uVar10 == 0x53504543) {
          if (max < 2) {
            pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string
                      ((string *)&local_178,"LWO: SPEC chunk is too small",&local_1b1);
            DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
            __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = *puVar8;
          *outFile = (uint8_t *)((long)puVar8 + 2);
          local_1b0[-1].mSpecularValue =
               (float)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8) / 255.0;
        }
        else {
          list = local_190;
          if (uVar10 == 0x53544558) goto LAB_005aee60;
          if (uVar10 == 0x54464c47) {
            if (max < 2) {
              pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string
                        ((string *)&local_178,"LWO: TFLG chunk is too small",&local_1b1);
              DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
              __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (out == (Texture *)0x0) {
              pLVar4 = DefaultLogger::get();
              message = "LWOB: Unexpected TFLG chunk";
LAB_005aef0b:
              Logger::warn(pLVar4,message);
              goto LAB_005aef10;
            }
            uVar2 = (ushort)*puVar8 >> 8;
            *outFile = (uint8_t *)((long)puVar8 + 2);
            AVar6 = AXIS_X;
            if ((((uVar2 & 1) != 0) || (AVar6 = AXIS_Y, (uVar2 & 2) != 0)) ||
               (AVar6 = AXIS_Z, (uVar2 & 4) != 0)) {
              out->majorAxis = AVar6;
            }
            if ((uVar2 & 0x10) != 0) {
              pLVar4 = DefaultLogger::get();
              Logger::warn(pLVar4,"LWOB: Ignoring \'negate\' flag on texture");
            }
          }
          else if (uVar10 == 0x54494d47) {
            if (out == (Texture *)0x0) {
              pLVar4 = DefaultLogger::get();
              message = "LWOB: Unexpected TIMG chunk";
              goto LAB_005aef0b;
            }
            GetS0(local_1a8,&out->mFileName,max);
          }
          else if (uVar10 == 0x5452414e) {
            if (uVar7 < 2) {
              pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string
                        ((string *)&local_178,"LWO: TRAN chunk is too small",&local_1b1);
              DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
              __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar7 = *puVar8;
            *outFile = (uint8_t *)((long)puVar8 + 2);
            local_1b0[-1].mTransparency =
                 (float)(ushort)((ushort)uVar7 << 8 | (ushort)uVar7 >> 8) / 255.0;
          }
          else {
            list = local_180;
            if (uVar10 == 0x54544558) goto LAB_005aee60;
            if (uVar10 == 0x434f4c52) {
              if (uVar7 < 3) {
                pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                std::__cxx11::string::string
                          ((string *)&local_178,"LWO: COLR chunk is too small",&local_1b1);
                DeadlyImportError::DeadlyImportError(pDVar5,&local_178.mName);
                __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
              }
              *outFile = (byte *)((long)puVar8 + 1);
              local_1b0[-1].mColor.r = (float)(byte)*puVar8 / 255.0;
              pbVar9 = *outFile;
              *outFile = pbVar9 + 1;
              local_1b0[-1].mColor.g = (float)*pbVar9 / 255.0;
              pbVar9 = *outFile;
              *outFile = pbVar9 + 1;
              local_1b0[-1].mColor.b = (float)*pbVar9 / 255.0;
            }
          }
        }
      }
    }
    pbVar9 = (byte *)((long)puVar8 + uVar12);
    *outFile = pbVar9;
  } while( true );
}

Assistant:

void LWOImporter::LoadLWOBSurface(unsigned int size)
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    mSurfaces->push_back( LWO::Surface () );
    LWO::Surface& surf = mSurfaces->back();
    LWO::Texture* pTex = NULL;

    GetS0(surf.mName,size);
    bool running = true;
    while (running)    {
        if (mFileBuffer + 6 >= end)
            break;

        IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        /*  A single test file (sonycam.lwo) seems to have invalid surface chunks.
         *  I'm assuming it's the fault of a single, unknown exporter so there are
         *  probably THOUSANDS of them. Here's a dirty workaround:
         *
         *  We don't break if the chunk limit is exceeded. Instead, we're computing
         *  how much storage is actually left and work with this value from now on.
         */
        if (mFileBuffer + head.length > end) {
            ASSIMP_LOG_ERROR("LWOB: Invalid surface chunk length. Trying to continue.");
            head.length = (uint16_t) (end - mFileBuffer);
        }

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
        // diffuse color
        case AI_LWO_COLR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,COLR,3);
                surf.mColor.r = GetU1() / 255.0f;
                surf.mColor.g = GetU1() / 255.0f;
                surf.mColor.b = GetU1() / 255.0f;
                break;
            }
        // diffuse strength ...
        case AI_LWO_DIFF:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,DIFF,2);
                surf.mDiffuseValue = GetU2() / 255.0f;
                break;
            }
        // specular strength ...
        case AI_LWO_SPEC:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPEC,2);
                surf.mSpecularValue = GetU2() / 255.0f;
                break;
            }
        // luminosity ...
        case AI_LWO_LUMI:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LUMI,2);
                surf.mLuminosity = GetU2() / 255.0f;
                break;
            }
        // transparency
        case AI_LWO_TRAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TRAN,2);
                surf.mTransparency = GetU2() / 255.0f;
                break;
            }
        // surface flags
        case AI_LWO_FLAG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,FLAG,2);
                uint16_t flag = GetU2();
                if (flag & 0x4 )   surf.mMaximumSmoothAngle = 1.56207f;
                if (flag & 0x8 )   surf.mColorHighlights = 1.f;
                if (flag & 0x100)  surf.bDoubleSided = true;
                break;
            }
        // maximum smoothing angle
        case AI_LWO_SMAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SMAN,4);
                surf.mMaximumSmoothAngle = std::fabs( GetF4() );
                break;
            }
        // glossiness
        case AI_LWO_GLOS:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,GLOS,2);
                surf.mGlossiness = (float)GetU2();
                break;
            }
        // color texture
        case AI_LWO_CTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mColorTextures,
                    head.length);
                break;
            }
        // diffuse texture
        case AI_LWO_DTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mDiffuseTextures,
                    head.length);
                break;
            }
        // specular texture
        case AI_LWO_STEX:
            {
                pTex = SetupNewTextureLWOB(surf.mSpecularTextures,
                    head.length);
                break;
            }
        // bump texture
        case AI_LWO_BTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mBumpTextures,
                    head.length);
                break;
            }
        // transparency texture
        case AI_LWO_TTEX:
            {
                pTex = SetupNewTextureLWOB(surf.mOpacityTextures,
                    head.length);
                break;
            }
        // texture path
        case AI_LWO_TIMG:
            {
                if (pTex)   {
                    GetS0(pTex->mFileName,head.length);
                } else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TIMG chunk");
                }
                break;
            }
        // texture strength
        case AI_LWO_TVAL:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TVAL,1);
                if (pTex)   {
                    pTex->mStrength = (float)GetU1()/ 255.f;
                } else {
                    ASSIMP_LOG_ERROR("LWOB: Unexpected TVAL chunk");
                }
                break;
            }
        // texture flags
        case AI_LWO_TFLG:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TFLG,2);

                if (nullptr != pTex) {
                    const uint16_t s = GetU2();
                    if (s & 1)
                        pTex->majorAxis = LWO::Texture::AXIS_X;
                    else if (s & 2)
                        pTex->majorAxis = LWO::Texture::AXIS_Y;
                    else if (s & 4)
                        pTex->majorAxis = LWO::Texture::AXIS_Z;

                    if (s & 16) {
                        ASSIMP_LOG_WARN("LWOB: Ignoring \'negate\' flag on texture");
                    }
                }
                else {
                    ASSIMP_LOG_WARN("LWOB: Unexpected TFLG chunk");
                }
                break;
            }
        }
        mFileBuffer = next;
    }
}